

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.hpp
# Opt level: O0

void __thiscall
PieceWiseCubicSpline<2>::_Spline::interp
          (_Spline *this,PieceWiseCubicSpline<2> *host,vector<double,_std::allocator<double>_> *t,
          VectorXd *y)

{
  pointer *__return_storage_ptr__;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Scalar SVar8;
  size_type sVar9;
  size_type sVar10;
  Index IVar11;
  CoeffReturnType pdVar12;
  const_reference pvVar13;
  Scalar *pSVar14;
  double dVar15;
  Scalar local_610;
  double h;
  undefined1 auStack_3d8 [4];
  int i_1;
  Matrix<double,__1,_1,_0,__1,_1> *local_3d0;
  undefined1 local_3c8 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_178;
  undefined1 local_170 [8];
  SparseMatrix<double,_0,_int> A;
  int local_120;
  int local_11c;
  double local_118;
  int local_110;
  int local_10c;
  double local_108;
  int local_100;
  int local_fc;
  double local_f8;
  int local_f0;
  int local_ec;
  double local_e8;
  int local_e0 [2];
  double local_d8;
  int local_d0 [2];
  double local_c8;
  int local_c0 [2];
  double local_b8;
  int local_b0 [2];
  double local_a8;
  int local_9c;
  double local_98;
  double local_90;
  int local_84;
  int local_80 [2];
  int i;
  undefined1 local_70 [8];
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  undefined1 local_40 [8];
  VectorXd d;
  int N;
  VectorXd *y_local;
  vector<double,_std::allocator<double>_> *t_local;
  PieceWiseCubicSpline<2> *host_local;
  _Spline *this_local;
  
  sVar9 = std::vector<double,_std::allocator<double>_>::size(t);
  sVar10 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y);
  if (sVar9 != sVar10) {
    __assert_fail("t.size() == y.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                  ,0x44,
                  "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                 );
  }
  IVar11 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                     ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y);
  d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       (int)IVar11;
  this->t_ptr = t;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->y,y);
  __return_storage_ptr__ =
       &triplets.
        super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)__return_storage_ptr__,
             (long)d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ._4_4_);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)__return_storage_ptr__);
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::vector
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             local_70);
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::reserve
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             local_70,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows._4_4_ * 3));
  for (local_80[0] = 1;
      local_80[0] <
      d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ + -1;
      local_80[0] = local_80[0] + 1) {
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(local_80[0] + 1));
    dVar15 = *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)local_80[0]);
    dVar1 = *pdVar12;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(local_80[0] + 1));
    dVar2 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)local_80[0]);
    dVar3 = *pvVar13;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)local_80[0]);
    dVar4 = *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(local_80[0] + -1));
    dVar5 = *pdVar12;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)local_80[0]);
    dVar6 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(local_80[0] + -1));
    dVar7 = *pvVar13;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                         (long)local_80[0]);
    *pSVar14 = (dVar15 - dVar1) / (dVar2 - dVar3) - (dVar4 - dVar5) / (dVar6 - dVar7);
    local_84 = local_80[0] + -1;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)local_80[0]);
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(local_80[0] + -1));
    local_90 = (dVar15 - *pvVar13) / 3.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int&,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,local_80,&local_84,&local_90);
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(local_80[0] + 1));
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(local_80[0] + -1));
    local_98 = ((dVar15 - *pvVar13) + (dVar15 - *pvVar13)) / 3.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int&,int&,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,local_80,local_80,&local_98);
    local_9c = local_80[0] + 1;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(local_80[0] + 1));
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)local_80[0]);
    local_a8 = (dVar15 - *pvVar13) / 3.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int&,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,local_80,&local_9c,&local_a8);
  }
  if (host->left_condition_ == SecondDeriv) {
    local_b0[1] = 0;
    local_b0[0] = 0;
    local_b8 = 2.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,local_b0 + 1,local_b0,&local_b8);
    local_c0[1] = 0;
    local_c0[0] = 1;
    local_c8 = 0.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,local_c0 + 1,local_c0,&local_c8);
    SVar8 = host->left_cond_value_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0);
    *pSVar14 = SVar8;
  }
  else {
    if (host->left_condition_ != FirstDeriv) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                    ,0x65,
                    "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                   );
    }
    local_d0[1] = 0;
    local_d0[0] = 0;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,1);
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,0);
    local_d8 = (dVar15 - *pvVar13) + (dVar15 - *pvVar13);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,local_d0 + 1,local_d0,&local_d8);
    local_e0[1] = 0;
    local_e0[0] = 1;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,1);
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,0);
    local_e8 = dVar15 - *pvVar13;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,local_e0 + 1,local_e0,&local_e8);
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,1);
    dVar15 = *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,0);
    dVar1 = *pdVar12;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,1);
    dVar2 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,0);
    dVar3 = *pvVar13;
    dVar4 = host->left_cond_value_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0);
    *pSVar14 = ((dVar15 - dVar1) / (dVar2 - dVar3) - dVar4) * 3.0;
  }
  if (host->right_condition_ == SecondDeriv) {
    local_ec = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
               _4_4_ + -1;
    local_f0 = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
               _4_4_ + -1;
    local_f8 = 2.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,&local_ec,&local_f0,&local_f8);
    local_fc = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
               _4_4_ + -1;
    local_100 = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ + -2;
    local_108 = 0.0;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,&local_fc,&local_100,&local_108);
    SVar8 = host->right_cond_value_;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                         (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_ + -1));
    *pSVar14 = SVar8;
  }
  else {
    if (host->right_condition_ != FirstDeriv) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/cubic_spline.hpp"
                    ,0x77,
                    "void PieceWiseCubicSpline<>::_Spline::interp(PieceWiseCubicSpline<> &, const vector<double> &, const Eigen::VectorXd &) [PointDim = 2]"
                   );
    }
    local_10c = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ + -1;
    local_110 = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ + -1;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ + -1));
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ + -2));
    local_118 = (dVar15 - *pvVar13) + (dVar15 - *pvVar13);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,&local_10c,&local_110,&local_118);
    local_11c = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ + -1;
    local_120 = d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ + -2;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ + -1));
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ + -2));
    A.m_data.m_allocatedSize = (Index)(dVar15 - *pvVar13);
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    emplace_back<int,int,double>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               local_70,&local_11c,&local_120,(double *)&A.m_data.m_allocatedSize);
    dVar15 = host->right_cond_value_;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_ + -1));
    dVar1 = *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_ + -2));
    dVar2 = *pdVar12;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ + -1));
    dVar3 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows._4_4_ + -2));
    dVar4 = *pvVar13;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                         (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_ + -1));
    *pSVar14 = (dVar15 - (dVar1 - dVar2) / (dVar3 - dVar4)) * 3.0;
  }
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)local_170,
             (long)d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ._4_4_,
             (long)d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ._4_4_);
  local_178._M_current =
       (Triplet<double,_int> *)
       std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
       begin((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             local_70);
  solver.m_detPermC =
       (Index)std::
              vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
              end((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                   *)local_70);
  Eigen::SparseMatrix<double,0,int>::
  setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
            ((SparseMatrix<double,0,int> *)local_170,&local_178,
             (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              *)&solver.m_detPermC);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_3c8
            );
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_3c8
             ,(MatrixType *)local_170);
  _auStack_3d8 = Eigen::
                 SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                 ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                             *)local_3c8,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->b,
             (DenseBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)auStack_3d8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ._4_4_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ._4_4_);
  for (h._4_4_ = 0;
      h._4_4_ < d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ + -1; h._4_4_ = h._4_4_ + 1) {
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->b,
                         (long)(h._4_4_ + 1));
    dVar15 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->b,
                         (long)h._4_4_);
    dVar1 = *pSVar14;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(h._4_4_ + 1));
    dVar2 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)h._4_4_);
    dVar3 = *pvVar13;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->a,
                         (long)h._4_4_);
    *pSVar14 = ((dVar15 - dVar1) / (dVar2 - dVar3)) / 3.0;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)(h._4_4_ + 1));
    dVar15 = *pdVar12;
    pdVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)y,
                         (long)h._4_4_);
    dVar1 = *pdVar12;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(h._4_4_ + 1));
    dVar2 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)h._4_4_);
    dVar3 = *pvVar13;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->b,
                         (long)h._4_4_);
    dVar4 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->b,
                         (long)(h._4_4_ + 1));
    dVar5 = *pSVar14;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)(h._4_4_ + 1));
    dVar6 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](t,(long)h._4_4_);
    dVar7 = *pvVar13;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->c,
                         (long)h._4_4_);
    *pSVar14 = (dVar15 - dVar1) / (dVar2 - dVar3) +
               ((dVar4 + dVar4 + dVar5) * (dVar6 - dVar7)) / -3.0;
  }
  if ((host->force_linear_extrapolation_ & 1U) == 0) {
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->b,0);
    local_610 = *pSVar14;
  }
  else {
    local_610 = 0.0;
  }
  this->b0 = local_610;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->c,0);
  this->c0 = *pSVar14;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                      (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_ + -1));
  dVar15 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                      (t,(long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_ + -2));
  dVar15 = dVar15 - *pvVar13;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->a,
                       (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_ + -1));
  *pSVar14 = 0.0;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->a,
                       (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_ + -2));
  dVar1 = *pSVar14;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->b,
                       (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_ + -2));
  dVar2 = *pSVar14;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->c,
                       (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_ + -2));
  dVar3 = *pSVar14;
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->c,
                       (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows._4_4_ + -1));
  *pSVar14 = dVar1 * 3.0 * dVar15 * dVar15 + (dVar2 + dVar2) * dVar15 + dVar3;
  if ((host->force_linear_extrapolation_ & 1U) != 0) {
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->b,
                         (long)(d.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows._4_4_ + -1));
    *pSVar14 = 0.0;
  }
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_3c8
            );
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)local_170);
  std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::~vector
            ((vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> *)
             local_70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  return;
}

Assistant:

void interp(PieceWiseCubicSpline<>& host, const vector<double>& t, const Eigen::VectorXd& y) {
      assert(t.size() == y.size());
      const int N = y.size();
      this->t_ptr = &t;
      this->y = y;

      // build Am=d
      Eigen::VectorXd d = Eigen::VectorXd::Zero(N);
      vector<Eigen::Triplet<double>> triplets;
      triplets.reserve(3 * N);

      // build h
      for (int i = 1; i < N - 1; ++i) {
        d[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) - (y[i] - y[i - 1]) / (t[i] - t[i - 1]);
        triplets.emplace_back(i, i - 1, (t[i] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i, 2 * (t[i + 1] - t[i - 1]) / 3.0);
        triplets.emplace_back(i, i + 1, (t[i + 1] - t[i]) / 3.0);
      }

      // boundary conditions
      if (host.left_condition_ == SecondDeriv) {
        // 2*b[0] = f''
        triplets.emplace_back(0, 0, 2.0);
        triplets.emplace_back(0, 1, 0.0);

        d[0] = host.left_cond_value_;
      } else if (host.left_condition_ == FirstDeriv) {
        // c[0] = f', needs to be re-expressed in terms of b:
        // (2b[0]+b[1])(x[1]-x[0]) = 3 ((y[1]-y[0])/(x[1]-x[0]) - f')
        triplets.emplace_back(0, 0, 2.0 * (t[1] - t[0]));
        triplets.emplace_back(0, 1, 1.0 * (t[1] - t[0]));

        d[0] = 3.0 * ((y[1] - y[0]) / (t[1] - t[0]) - host.left_cond_value_);
      } else {
        assert(false);
      }
      if (host.right_condition_ == SecondDeriv) {
        // 2*b[n-1] = f''
        triplets.emplace_back(N - 1, N - 1, 2.0);
        triplets.emplace_back(N - 1, N - 2, 0.0);

        d[N - 1] = host.right_cond_value_;

      } else if (host.right_condition_ == FirstDeriv) {
        // c[n-1] = f', needs to be re-expressed in terms of b:
        // (b[n-2]+2b[n-1])(x[n-1]-x[n-2])
        // = 3 (f' - (y[n-1]-y[n-2])/(x[n-1]-x[n-2]))
        triplets.emplace_back(N - 1, N - 1, 2.0 * (t[N - 1] - t[N - 2]));
        triplets.emplace_back(N - 1, N - 2, 1.0 * (t[N - 1] - t[N - 2]));

        d[N - 1] = 3.0 * (host.right_cond_value_ - (y[N - 1] - y[N - 2]) / (t[N - 1] - t[N - 2]));
      } else {
        assert(false);
      }

      // solve the equation system to obtain the parameters b[]
      Eigen::SparseMatrix<double> A(N, N);
      A.setFromTriplets(triplets.begin(), triplets.end());

      Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
      solver.compute(A);
      b = solver.solve(d);

      a.resize(N);
      c.resize(N);
      for (int i = 0; i < N - 1; i++) {
        a[i] = (b[i + 1] - b[i]) / (t[i + 1] - t[i]) / 3.0;
        c[i] = (y[i + 1] - y[i]) / (t[i + 1] - t[i]) -
               (2.0 * b[i] + b[i + 1]) * (t[i + 1] - t[i]) / 3.0;
      }

      // for left extrapolation coefficients
      b0 = (!host.force_linear_extrapolation_) ? b[0] : 0.0;
      c0 = c[0];

      // for the right extrapolation coefficients
      // f_{n-1}(x) = b*(x-x_{n-1})^2 + c*(x-x_{n-1}) + y{n-1}
      double h = t[N - 1] - t[N - 2];
      // b[N-1] is determined by the boundary condition
      a[N - 1] = 0.0;
      c[N - 1] = 3.0 * a[N - 2] * h * h + 2.0 * b[N - 2] * h + c[N - 2];  // = f'_{n-2}(x_{n-1})
      if (host.force_linear_extrapolation_) {
        {
          b[N - 1] = 0.0;
        }
      }
    }